

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_page.c
# Opt level: O2

int set_new_page(FIELD *field,_Bool new_page_flag)

{
  undefined2 uVar1;
  int *piVar2;
  int iVar3;
  
  if (field == (FIELD *)0x0) {
    field = _nc_Default_Field;
  }
  if (field->form == (formnode *)0x0) {
    uVar1 = field->status;
    field->status = (uVar1 & 0xfffb) + (ushort)new_page_flag * 4;
    iVar3 = 0;
  }
  else {
    iVar3 = -4;
  }
  piVar2 = __errno_location();
  *piVar2 = iVar3;
  return iVar3;
}

Assistant:

int set_new_page(FIELD * field, bool new_page_flag)
{
  Normalize_Field(field);
  if (field->form) 
    RETURN(E_CONNECTED);

  if (new_page_flag) 
    field->status |= _NEWPAGE;
  else
    field->status &= ~_NEWPAGE;

  RETURN(E_OK);
}